

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::AddTriangleMesh
          (ChConvexDecompositionHACD *this,ChTriangleMesh *tm)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  
  iVar1 = (*(tm->super_ChGeometry)._vptr_ChGeometry[0xd])(tm);
  bVar2 = iVar1 < 1;
  if (0 < iVar1) {
    (*(tm->super_ChGeometry)._vptr_ChGeometry[0xe])(local_80,tm,0);
    iVar1 = (*(this->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[3])
                      (this,local_78,local_60,local_48);
    if ((char)iVar1 != '\0') {
      uVar3 = 1;
      do {
        iVar1 = (*(tm->super_ChGeometry)._vptr_ChGeometry[0xd])(tm);
        bVar2 = iVar1 <= (int)uVar3;
        if (iVar1 <= (int)uVar3) {
          return bVar2;
        }
        (*(tm->super_ChGeometry)._vptr_ChGeometry[0xe])(local_80,tm,(ulong)uVar3);
        iVar1 = (*(this->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[3])
                          (this,local_78,local_60,local_48);
        uVar3 = uVar3 + 1;
      } while ((char)iVar1 != '\0');
    }
  }
  return bVar2;
}

Assistant:

bool ChConvexDecompositionHACD::AddTriangleMesh(const geometry::ChTriangleMesh& tm) {
    for (int i = 0; i < tm.getNumTriangles(); i++) {
        if (!this->ChConvexDecomposition::AddTriangle(tm.getTriangle(i)))
            return false;
    }
    return true;
}